

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_rdp_queue.c
# Opt level: O0

void csp_rdp_queue_flush(csp_conn_t *conn)

{
  long in_RDI;
  csp_conn_t *in_stack_00000008;
  csp_queue_handle_t in_stack_00000010;
  
  if (in_RDI == 0) {
    csp_queue_empty((csp_queue_handle_t)0x10ebe8);
    csp_queue_empty((csp_queue_handle_t)0x10ebf4);
  }
  else {
    __csp_rdp_queue_flush(in_stack_00000010,in_stack_00000008);
    __csp_rdp_queue_flush(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void csp_rdp_queue_flush(csp_conn_t * conn) {

	if (conn == NULL) {
		csp_queue_empty(tx_queue);
		csp_queue_empty(rx_queue);
	} else {
		(void)__csp_rdp_queue_flush(tx_queue, conn);
		(void)__csp_rdp_queue_flush(rx_queue, conn);
	}
}